

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O1

bool testValue(cmState *state,string *key,string *value,string *keyDescription,string *errorMessage)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  long *plVar3;
  long *plVar4;
  bool bVar5;
  undefined1 *local_f0;
  size_t local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  __s = cmState::GetCacheEntryValue(state,key);
  local_f0 = &local_e0;
  if (__s == (char *)0x0) {
    local_e8 = 0;
    local_e0 = 0;
  }
  else {
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,__s,__s + sVar2);
  }
  if ((local_e8 == 0) || (value->_M_string_length == 0)) {
LAB_002585bb:
    bVar5 = true;
    if (value->_M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)value);
    }
  }
  else {
    if (local_e8 == value->_M_string_length) {
      iVar1 = bcmp(local_f0,(value->_M_dataplus)._M_p,local_e8);
      if (iVar1 == 0) goto LAB_002585bb;
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"\"","");
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_50,(ulong)(key->_M_dataplus)._M_p);
    local_d0 = &local_c0;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_c0 = *plVar4;
      lStack_b8 = plVar3[3];
    }
    else {
      local_c0 = *plVar4;
      local_d0 = (long *)*plVar3;
    }
    local_c8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar4;
      local_90 = (long *)*plVar3;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)(keyDescription->_M_dataplus)._M_p);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_60 = *plVar4;
      lStack_58 = plVar3[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar4;
      local_70 = (long *)*plVar3;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_a0 = *plVar4;
      lStack_98 = plVar3[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar4;
      local_b0 = (long *)*plVar3;
    }
    local_a8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (errorMessage != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)errorMessage);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    bVar5 = false;
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  return bVar5;
}

Assistant:

static bool testValue(cmState* state, const std::string& key,
                      std::string& value, const std::string& keyDescription,
                      std::string* errorMessage)
{
  const char* entry = state->GetCacheEntryValue(key);
  const std::string cachedValue =
    entry == nullptr ? std::string() : std::string(entry);
  if (!cachedValue.empty() && !value.empty() && cachedValue != value) {
    setErrorMessage(errorMessage, std::string("\"") + key +
                      "\" is set but incompatible with configured " +
                      keyDescription + " value.");
    return false;
  }
  if (value.empty()) {
    value = cachedValue;
  }
  return true;
}